

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::CannotAllocateArgumentsObjectOnStack(GlobOpt *this,Func *curFunc)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  char16 *pcVar3;
  char16 *pcVar4;
  JITOutputIDL *pJVar5;
  undefined4 *puVar6;
  undefined1 *puVar7;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  if ((curFunc != (Func *)0x0) && ((curFunc->field_0x240 & 0x80) != 0)) {
    pJVar5 = JITOutput::GetOutputData(&curFunc->m_output);
    if (pJVar5->disableStackArgOpt != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3f02,"(!curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt)",
                         "!curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    pJVar5 = JITOutput::GetOutputData(&curFunc->m_output);
    pJVar5->disableStackArgOpt = '\x01';
    puVar7 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar7 = 0x2b;
    __cxa_throw(puVar7,&Js::RejitException::typeinfo,0);
  }
  puVar7 = &this->func->field_0x240;
  *(uint *)puVar7 = *(uint *)puVar7 & 0xffffffbf;
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,StackArgOptPhase,sourceContextId,functionId)
  ;
  if (bVar2) {
    this_00 = Func::GetJITFunctionBody(this->func);
    pcVar3 = JITTimeFunctionBody::GetDisplayName(this_00);
    pcVar4 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_78);
    Output::Print(L"Stack args disabled for function %s(%s)\n",pcVar3,pcVar4);
    Output::Flush();
  }
  return;
}

Assistant:

void
GlobOpt::CannotAllocateArgumentsObjectOnStack(Func * curFunc)
{
    if (curFunc != nullptr && curFunc->hasArgLenAndConstOpt)
    {
        Assert(!curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt);
        curFunc->GetJITOutput()->GetOutputData()->disableStackArgOpt = true;
        throw Js::RejitException(RejitReason::DisableStackArgLenAndConstOpt);
    }

    func->SetHasStackArgs(false);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (PHASE_TESTTRACE(Js::StackArgOptPhase, this->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("Stack args disabled for function %s(%s)\n"), func->GetJITFunctionBody()->GetDisplayName(), func->GetDebugNumberSet(debugStringBuffer));
        Output::Flush();
    }
#endif
}